

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeCommandListGetContextHandle
          (ze_command_list_handle_t hCommandList,ze_context_handle_t *phContext)

{
  ze_context_handle_t p_Var1;
  ze_pfnCommandListGetContextHandle_t pfnGetContextHandle;
  ze_result_t result;
  ze_context_handle_t *phContext_local;
  ze_command_list_handle_t hCommandList_local;
  
  pfnGetContextHandle._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c438 == (code *)0x0) {
    p_Var1 = (ze_context_handle_t)context_t::get((context_t *)&context);
    *phContext = p_Var1;
  }
  else {
    pfnGetContextHandle._4_4_ = (*DAT_0011c438)(hCommandList,phContext);
  }
  return pfnGetContextHandle._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListGetContextHandle(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        ze_context_handle_t* phContext                  ///< [out] handle of the context on which the command list was created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetContextHandle = context.zeDdiTable.CommandList.pfnGetContextHandle;
        if( nullptr != pfnGetContextHandle )
        {
            result = pfnGetContextHandle( hCommandList, phContext );
        }
        else
        {
            // generic implementation
            *phContext = reinterpret_cast<ze_context_handle_t>( context.get() );

        }

        return result;
    }